

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

uint32_t memory_tree_ns::over_lap(v_array<unsigned_int> *array_1,v_array<unsigned_int> *array_2)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  
  qsort(array_1->_begin,(long)array_1->_end - (long)array_1->_begin >> 2,4,compare_label);
  qsort(array_2->_begin,(long)array_2->_end - (long)array_2->_begin >> 2,4,compare_label);
  uVar4 = 0;
  uVar5 = 0;
  uVar3 = 0;
  do {
    while( true ) {
      if (((ulong)((long)array_1->_end - (long)array_1->_begin >> 2) <= (ulong)uVar5) ||
         ((ulong)((long)array_2->_end - (long)array_2->_begin >> 2) <= (ulong)uVar4)) {
        return uVar3;
      }
      uVar1 = array_2->_begin[uVar4];
      uVar2 = array_1->_begin[uVar5];
      if (uVar1 <= uVar2) break;
      uVar5 = uVar5 + 1;
    }
    if (uVar2 <= uVar1) {
      uVar3 = uVar3 + 1;
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

inline uint32_t over_lap(v_array<uint32_t>& array_1, v_array<uint32_t>& array_2){
        uint32_t num_overlap = 0;
        
        qsort(array_1.begin(), array_1.size(), sizeof(uint32_t), compare_label);
        qsort(array_2.begin(), array_2.size(), sizeof(uint32_t), compare_label);

        uint32_t idx1 = 0;
        uint32_t idx2 = 0;
        while (idx1 < array_1.size() && idx2 < array_2.size())
        {
            uint32_t c1 = array_1[idx1];
            uint32_t c2 = array_2[idx2];
            if (c1 < c2)
                idx1++;
            else if (c1 > c2)
                idx2++;
            else{
                num_overlap++;
                idx1++;
                idx2++;
            }
        }
        return num_overlap;
    }